

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring64_bitmap_t * roaring64_bitmap_of_ptr(size_t n_args,uint64_t *vals)

{
  roaring64_bitmap_t *r;
  long lVar1;
  roaring64_bulk_context_t context;
  roaring64_bulk_context_t local_38;
  
  r = (roaring64_bitmap_t *)(*global_memory_hook.malloc)(0xb8);
  (r->art).root = 0;
  (r->art).first_free[0] = 0;
  (r->art).first_free[1] = 0;
  (r->art).first_free[2] = 0;
  (r->art).first_free[3] = 0;
  (r->art).first_free[4] = 0;
  (r->art).first_free[5] = 0;
  (r->art).capacities[0] = 0;
  (r->art).capacities[1] = 0;
  (r->art).capacities[2] = 0;
  (r->art).capacities[3] = 0;
  (r->art).capacities[4] = 0;
  (r->art).capacities[5] = 0;
  (r->art).nodes[1] = (art_node_t *)0x0;
  (r->art).nodes[2] = (art_node_t *)0x0;
  (r->art).nodes[3] = (art_node_t *)0x0;
  (r->art).nodes[4] = (art_node_t *)0x0;
  *(undefined8 *)((long)(r->art).nodes + 0x21) = 0;
  *(undefined8 *)((long)(r->art).nodes + 0x29) = 0;
  r->first_free = 0;
  r->capacity = 0;
  r->containers = (container_t **)0x0;
  if (n_args != 0) {
    local_38.high_bytes[0] = '\0';
    local_38.high_bytes[1] = '\0';
    local_38.high_bytes[2] = '\0';
    local_38.high_bytes[3] = '\0';
    local_38.high_bytes[4] = '\0';
    local_38.high_bytes[5] = '\0';
    local_38._6_2_ = 0;
    local_38.leaf = (roaring64_leaf_t *)0x0;
    lVar1 = 0;
    do {
      roaring64_bitmap_add_bulk(r,&local_38,*(uint64_t *)((long)vals + lVar1));
      lVar1 = lVar1 + 8;
    } while (n_args << 3 != lVar1);
  }
  return r;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_of_ptr(size_t n_args,
                                            const uint64_t *vals) {
    roaring64_bitmap_t *r = roaring64_bitmap_create();
    roaring64_bitmap_add_many(r, n_args, vals);
    return r;
}